

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ZSTD_customMem customMem;
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ZSTD_DDictHashSet *pZVar4;
  size_t code;
  void *in_stack_ffffffffffffffd0;
  size_t err_code;
  ZSTD_DDict *ddict_local;
  ZSTD_DCtx *dctx_local;
  
  if (dctx->streamStage == zdss_init) {
    ZSTD_clearDict(dctx);
    if (ddict != (ZSTD_DDict *)0x0) {
      dctx->ddict = ddict;
      dctx->dictUses = ZSTD_use_indefinitely;
      if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
        if (dctx->ddictSet == (ZSTD_DDictHashSet *)0x0) {
          uVar1 = (dctx->customMem).customFree;
          uVar2 = (dctx->customMem).opaque;
          customMem.customFree = (ZSTD_freeFunction)uVar2;
          customMem.customAlloc = (ZSTD_allocFunction)uVar1;
          customMem.opaque = in_stack_ffffffffffffffd0;
          pZVar4 = ZSTD_createDDictHashSet(customMem);
          dctx->ddictSet = pZVar4;
          if (dctx->ddictSet == (ZSTD_DDictHashSet *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        if (dctx->staticSize != 0) {
          __assert_fail("!dctx->staticSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                        ,0x6e6,"size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *, const ZSTD_DDict *)");
        }
        code = ZSTD_DDictHashSet_addDDict(dctx->ddictSet,ddict,dctx->customMem);
        uVar3 = ERR_isError(code);
        if (uVar3 != 0) {
          return code;
        }
      }
    }
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffc4;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}